

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

_Bool Curl_is_absolute_url(char *url,char *buf,size_t buflen)

{
  byte bVar1;
  int iVar2;
  uint c;
  size_t sVar3;
  
  if (buflen == 0) {
    return false;
  }
  sVar3 = 0;
  do {
    bVar1 = url[sVar3];
    if (bVar1 == 0) {
      return false;
    }
    c = (uint)bVar1;
    if (c == 0x3a) {
      if (buf != (char *)0x0) {
        buf[sVar3] = '\0';
        return true;
      }
      return true;
    }
    iVar2 = Curl_isalnum(c);
    if (iVar2 == 0) {
      if (0x2e < c) {
        return false;
      }
      if ((0x680000000000U >> ((ulong)c & 0x3f) & 1) == 0) {
        return false;
      }
    }
    if (buf != (char *)0x0) {
      iVar2 = tolower((uint)bVar1);
      buf[sVar3] = (char)iVar2;
    }
    sVar3 = sVar3 + 1;
    if (buflen == sVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool Curl_is_absolute_url(const char *url, char *buf, size_t buflen)
{
  size_t i;
#ifdef WIN32
  if(STARTS_WITH_DRIVE_PREFIX(url))
    return FALSE;
#endif
  for(i = 0; i < buflen && url[i]; ++i) {
    char s = url[i];
    if(s == ':') {
      if(buf)
        buf[i] = 0;
      return TRUE;
    }
    /* RFC 3986 3.1 explains:
      scheme      = ALPHA *( ALPHA / DIGIT / "+" / "-" / "." )
    */
    else if(ISALNUM(s) || (s == '+') || (s == '-') || (s == '.') ) {
      if(buf)
        buf[i] = (char)TOLOWER(s);
    }
    else
      break;
  }
  return FALSE;
}